

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_prune.cpp
# Opt level: O0

void __thiscall
PruneReplayer::access_raytracing_pipeline
          (PruneReplayer *this,Hash hash,VkRayTracingPipelineCreateInfoKHR *create_info)

{
  Hash hash_00;
  bool bVar1;
  size_type sVar2;
  pointer ppVar3;
  pair<std::__detail::_Node_iterator<unsigned_long,_true,_false>,_bool> pVar4;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
  local_70;
  VkPipeline local_68;
  _Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
  local_60;
  iterator lib_itr;
  uint32_t i;
  VkShaderModule local_40;
  uint local_34;
  _Node_iterator_base<unsigned_long,_false> _Stack_30;
  uint32_t stage;
  undefined1 local_28;
  VkRayTracingPipelineCreateInfoKHR *local_20;
  VkRayTracingPipelineCreateInfoKHR *create_info_local;
  Hash hash_local;
  PruneReplayer *this_local;
  
  local_20 = create_info;
  create_info_local = (VkRayTracingPipelineCreateInfoKHR *)hash;
  hash_local = (Hash)this;
  sVar2 = std::
          unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
          ::count(&this->accessed_raytracing_pipelines,(key_type *)&create_info_local);
  if (sVar2 == 0) {
    pVar4 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::insert(&this->accessed_raytracing_pipelines,(value_type *)&create_info_local);
    _Stack_30._M_cur =
         (__node_type *)pVar4.first.super__Node_iterator_base<unsigned_long,_false>._M_cur;
    local_28 = pVar4.second;
    access_pipeline_layout(this,(Hash)local_20->layout);
    for (local_34 = 0; local_34 < local_20->stageCount; local_34 = local_34 + 1) {
      local_40 = local_20->pStages[local_34].module;
      std::
      unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
      ::insert(&this->accessed_shader_modules,(value_type *)&local_40);
    }
    if (local_20->pLibraryInfo != (VkPipelineLibraryCreateInfoKHR *)0x0) {
      for (lib_itr.
           super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
           ._M_cur._4_4_ = 0;
          lib_itr.
          super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
          ._M_cur._4_4_ < local_20->pLibraryInfo->libraryCount;
          lib_itr.
          super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
          ._M_cur._4_4_ =
               lib_itr.
               super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
               ._M_cur._4_4_ + 1) {
        local_68 = local_20->pLibraryInfo->pLibraries
                   [lib_itr.
                    super__Node_iterator_base<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false>
                    ._M_cur._4_4_];
        local_60._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
             ::find(&this->library_raytracing_pipelines,(key_type *)&local_68);
        local_70._M_cur =
             (__node_type *)
             std::
             unordered_map<unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>_>_>
             ::end(&this->library_raytracing_pipelines);
        bVar1 = std::__detail::operator!=(&local_60,&local_70);
        if (bVar1) {
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
                                 *)&local_60);
          hash_00 = ppVar3->first;
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
                   ::operator->((_Node_iterator<std::pair<const_unsigned_long,_const_VkRayTracingPipelineCreateInfoKHR_*>,_false,_false>
                                 *)&local_60);
          access_raytracing_pipeline(this,hash_00,ppVar3->second);
        }
      }
    }
  }
  return;
}

Assistant:

void access_raytracing_pipeline(Hash hash, const VkRayTracingPipelineCreateInfoKHR *create_info)
	{
		if (accessed_raytracing_pipelines.count(hash))
			return;
		accessed_raytracing_pipelines.insert(hash);

		access_pipeline_layout((Hash) create_info->layout);
		for (uint32_t stage = 0; stage < create_info->stageCount; stage++)
			accessed_shader_modules.insert((Hash) create_info->pStages[stage].module);

		if (create_info->pLibraryInfo)
		{
			for (uint32_t i = 0; i < create_info->pLibraryInfo->libraryCount; i++)
			{
				// Only need to recurse if a pipeline was only allowed due to having CREATE_LIBRARY_KHR flag.
				auto lib_itr = library_raytracing_pipelines.find((Hash) create_info->pLibraryInfo->pLibraries[i]);
				if (lib_itr != library_raytracing_pipelines.end())
					access_raytracing_pipeline(lib_itr->first, lib_itr->second);
			}
		}
	}